

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-type.cpp
# Opt level: O2

Up __thiscall yactfr::FixedLengthUnsignedIntegerType::_clone(FixedLengthUnsignedIntegerType *this)

{
  __uniq_ptr_impl<const_yactfr::FixedLengthUnsignedIntegerType,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
  _Var1;
  long in_RSI;
  BitOrder local_54;
  ByteOrder local_50;
  uint local_4c;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_48;
  __uniq_ptr_impl<const_yactfr::FixedLengthUnsignedIntegerType,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
  local_40;
  undefined4 local_38;
  DisplayBase local_34;
  
  local_4c = *(uint *)(in_RSI + 0xc);
  local_50 = *(ByteOrder *)(in_RSI + 0x18);
  local_54 = *(BitOrder *)(in_RSI + 0x1c);
  local_34 = *(DisplayBase *)(in_RSI + 0x20);
  local_38 = *(undefined4 *)(in_RSI + 0x28);
  internal::tryCloneAttrs((MapItem *)&local_48);
  std::
  make_unique<yactfr::FixedLengthUnsignedIntegerType_const,unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,yactfr::DisplayBase,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,std::set<yactfr::UnsignedIntegerTypeRole,std::less<yactfr::UnsignedIntegerTypeRole>,std::allocator<yactfr::UnsignedIntegerTypeRole>>const&>
            ((uint *)&local_40,&local_4c,&local_50,&local_54,&local_34,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              *)&stack0xffffffffffffffc8,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (in_RSI + 0x30),
             (set<yactfr::UnsignedIntegerTypeRole,_std::less<yactfr::UnsignedIntegerTypeRole>,_std::allocator<yactfr::UnsignedIntegerTypeRole>_>
              *)&local_48);
  _Var1._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_false>._M_head_impl =
       local_40._M_t.
       super__Tuple_impl<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
       .super__Head_base<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_false>._M_head_impl;
  local_40._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_false>._M_head_impl =
       (tuple<const_yactfr::FixedLengthUnsignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
        )(_Tuple_impl<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
          )0x0;
  (this->super_FixedLengthIntegerType<unsigned_long_long>).super_FixedLengthBitArrayType.
  super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
       .super__Head_base<0UL,_const_yactfr::FixedLengthUnsignedIntegerType_*,_false>._M_head_impl;
  std::
  unique_ptr<const_yactfr::FixedLengthUnsignedIntegerType,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
  ::~unique_ptr((unique_ptr<const_yactfr::FixedLengthUnsignedIntegerType,_std::default_delete<const_yactfr::FixedLengthUnsignedIntegerType>_>
                 *)&local_40);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_48);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthUnsignedIntegerType::_clone() const
{
    return FixedLengthUnsignedIntegerType::create(this->alignment(), this->length(),
                                                  this->byteOrder(), this->bitOrder(),
                                                  this->preferredDisplayBase(), this->mappings(),
                                                  internal::tryCloneAttrs(this->attributes()),
                                                  this->roles());
}